

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

bool libwebm::GetFileContents(string *file_name,string *contents)

{
  byte bVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  long lVar4;
  allocator local_241;
  string local_240 [32];
  char local_220 [8];
  ifstream file;
  string *contents_local;
  string *file_name_local;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,uVar2,8);
  uVar3 = GetFileSize(file_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,uVar3,'\0',&local_241);
  std::__cxx11::string::operator=((string *)contents,local_240);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  bVar1 = std::ios::good();
  if (((bVar1 & 1) != 0) && (lVar4 = std::__cxx11::string::size(), lVar4 != 0)) {
    lVar4 = std::__cxx11::string::operator[]((ulong)contents);
    std::__cxx11::string::size();
    std::istream::read(local_220,lVar4);
  }
  bVar1 = std::ios::fail();
  std::ifstream::~ifstream(local_220);
  return (bool)((bVar1 ^ 0xff) & 1);
}

Assistant:

bool GetFileContents(const std::string& file_name, std::string* contents) {
  std::ifstream file(file_name.c_str());
  *contents = std::string(static_cast<size_t>(GetFileSize(file_name)), 0);
  if (file.good() && contents->size()) {
    file.read(&(*contents)[0], contents->size());
  }
  return !file.fail();
}